

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O3

void server::whois_cmd(int cid,char **args,int argc)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  uint cn;
  int iVar4;
  char *pcVar5;
  clientinfo *ci;
  size_t sVar6;
  char *pcVar7;
  string s;
  Response res;
  Request req;
  string msg;
  string r_str;
  string amsg;
  char lmsg [3] [255];
  undefined1 local_ee8 [40];
  stringformatter local_ec0;
  undefined1 local_eb8 [40];
  _Alloc_hider local_e90;
  Request local_e80;
  string local_df8 [8];
  stringformatter local_ce8 [34];
  clientinfo local_bd8;
  char local_338 [255];
  char local_239 [521];
  
  bVar3 = QServ::getlastSA(&qs);
  if (bVar3) {
    cn = atoi(args[1]);
    if (1000 < cn) {
      iVar4 = QServ::getSender(&qs);
      pcVar5 = QServ::getCommandDesc(&qs,cid);
      goto LAB_001551ca;
    }
  }
  else {
    cn = QServ::getSender(&qs);
  }
  ci = QServ::getClient(&qs,cn);
  if (ci == (clientinfo *)0x0) {
    iVar4 = QServ::getSender(&qs);
    pcVar5 = "\f3Error: Player not connected";
LAB_001551ca:
    sendf(iVar4,1,"ris",0x23,pcVar5);
    return;
  }
  if (ci->connected != true) {
    return;
  }
  pcVar5 = QServ::cntoip(&qs,cn);
  iVar4 = strcmp("127.0.0.1",pcVar5);
  if (iVar4 == 0) {
    local_bd8.ip = "localhost";
  }
  else {
    QServ::cgip_abi_cxx11_((string *)&local_bd8,&qs,pcVar5);
    if ((int *)local_bd8.ip != &local_bd8.connectmillis) {
      operator_delete(local_bd8.ip);
    }
    if (local_bd8.ip == (char *)0x0) {
      builtin_strncpy(local_239,"Unknown Location",0x11);
      goto LAB_001551f9;
    }
  }
  strcpy(local_239,local_bd8.ip);
LAB_001551f9:
  QServ::getlastCI(&local_bd8,&qs);
  if (local_bd8.privilege == 3) {
    sprintf(local_338,"%s (%s)",local_239,pcVar5);
  }
  else {
    strcpy(local_338,local_239);
  }
  clientinfo::~clientinfo(&local_bd8);
  if (qs.enable_HTTP_geo == true) {
    local_bd8.ip = (char *)local_ce8;
    stringformatter::operator()
              ((stringformatter *)&local_bd8,"%s%s%s","http://ip-api.com/line/",pcVar5,
               "?fields=city,regionName,country");
    piVar1 = &local_bd8.connectmillis;
    local_bd8.ip = (char *)piVar1;
    sVar6 = strlen((char *)local_ce8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_bd8,local_ce8,(long)&local_ce8[0].buf + sVar6);
    http::Request::Request(&local_e80,(string *)&local_bd8,V4);
    if ((int *)local_bd8.ip != piVar1) {
      operator_delete(local_bd8.ip);
    }
    local_bd8.ip = (char *)piVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_bd8,"GET","");
    paVar2 = &local_df8[0].field_2;
    local_df8[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_df8,"");
    local_ee8._0_8_ = (pointer)0x0;
    local_ee8._8_8_ = (pointer)0x0;
    local_ee8._16_8_ = (pointer)0x0;
    http::Request::send((Request *)local_eb8,(int)&local_e80,&local_bd8,(size_t)local_df8,
                        (int)local_ee8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_ee8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_df8[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_df8[0]._M_dataplus._M_p);
    }
    if ((int *)local_bd8.ip != piVar1) {
      operator_delete(local_bd8.ip);
    }
    local_ee8._0_8_ = (pointer)(local_ee8 + 0x10);
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((string *)local_ee8,local_eb8._32_8_,local_e90._M_p);
    local_bd8.ip = (char *)piVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_bd8,"\n","");
    local_df8[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_df8," > ","");
    ::RString((string *)local_ee8,(string *)&local_bd8,local_df8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_df8[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_df8[0]._M_dataplus._M_p);
    }
    if ((int *)local_bd8.ip != piVar1) {
      operator_delete(local_bd8.ip);
    }
    ::UTFEncode((string *)local_ee8);
    std::__cxx11::string::erase
              ((ulong)local_ee8,(ulong)((long)&((pointer)(local_ee8._8_8_ + -0x20))->field_2 + 0xe))
    ;
    local_bd8.ip = (char *)local_df8;
    pcVar7 = colorname(ci);
    stringformatter::operator()
              ((stringformatter *)&local_bd8,"Name: \f0%s \f7CN: \f1%d \f7Location: \f6%s",pcVar7,
               (ulong)(uint)ci->clientnum,local_ee8._0_8_);
    iVar4 = QServ::getSender(&qs);
    sendf(iVar4,1,"ris",0x23,local_df8);
    QServ::getlastCI(&local_bd8,&qs);
    clientinfo::~clientinfo(&local_bd8);
    if (local_bd8.privilege == 3) {
      local_ec0.buf = (char *)&local_bd8;
      stringformatter::operator()(&local_ec0,"IP: \f2%s",pcVar5);
      iVar4 = QServ::getSender(&qs);
      sendf(iVar4,1,"ris",0x23,&local_bd8);
    }
    if ((pointer)local_ee8._0_8_ != (pointer)(local_ee8 + 0x10)) {
      operator_delete((void *)local_ee8._0_8_);
    }
    if ((void *)local_eb8._32_8_ != (void *)0x0) {
      operator_delete((void *)local_eb8._32_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_eb8 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e80.path._M_dataplus._M_p != &local_e80.path.field_2) {
      operator_delete(local_e80.path._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e80.port._M_dataplus._M_p != &local_e80.port.field_2) {
      operator_delete(local_e80.port._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e80.domain._M_dataplus._M_p != &local_e80.domain.field_2) {
      operator_delete(local_e80.domain._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e80.scheme._M_dataplus._M_p != &local_e80.scheme.field_2) {
      operator_delete(local_e80.scheme._M_dataplus._M_p);
    }
  }
  else {
    local_ce8[0].buf = (char *)&local_bd8;
    pcVar5 = colorname(ci);
    stringformatter::operator()
              (local_ce8,"Name: \f0%s \f7CN: \f1%d \f7Location: \f2%s",pcVar5,
               (ulong)(uint)ci->clientnum,local_338);
    iVar4 = QServ::getSender(&qs);
    sendf(iVar4,1,"ris",0x23,&local_bd8);
  }
  return;
}

Assistant:

QSERV_CALLBACK whois_cmd(p) {
        #include <stdio.h>

        bool usage = false;
        int cn = -1;

        if(CMD_SA) {
            cn = atoi(args[1]);
            if(cn >= 0 && cn <= 1000) {
                //if(!isalpha(cn)) {
                    sendinfo:
                    clientinfo *ci = qs.getClient(cn);

                    if(ci != NULL) {
                        if(ci->connected) {
                            char *ip = toip(cn), lmsg[3][255];
                            const char *location;

                            if(!strcmp("127.0.0.1", ip)) {
                                location = (char*)"localhost";
                            } else {
                                location = qs.cgip(ip).c_str(); //qs.congeoip(ip); <-- just country

                                if(!location) {
                                    sprintf(lmsg[1], "%s", "Unknown Location");
                                }
                            }
                            if(location) sprintf(lmsg[1], "%s", location);
                            (CMD_SCI.privilege == PRIV_ADMIN) ? sprintf(lmsg[0], "%s (%s)", lmsg[1], ip) : sprintf(lmsg[0], "%s", lmsg[1]);
                            if(qs.enable_HTTP_geo) {
                                try
                                {
                                    defformatstring(r_str)("%s%s%s", "http://ip-api.com/line/", ip, "?fields=city,regionName,country");
                                    http::Request req(r_str);
                                    const http::Response res = req.send("GET");
                                    std::string s(res.body.begin(), res.body.end());
                                    RString(s, "\n", " > ");
                                    UTFEncode(s);
                                    s.erase(s.length()-2, 2);
                                    defformatstring(msg)("Name: \f0%s \f7CN: \f1%d \f7Location: \f6%s", colorname(ci), ci->clientnum, s.c_str());
                                    sendf(CMD_SENDER, 1, "ris", N_SERVMSG, msg);
                                    if(CMD_SCI.privilege == PRIV_ADMIN){
                                        defformatstring(amsg)("IP: \f2%s", ip);
                                        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, amsg);
                                    }
                                }
                                catch (const std::exception& e)
                                {
                                    std::cerr << "HTTP geolocation localhost connect or failed with: " << e.what() << '\n';
                                }
                            }
                            else {
                                 defformatstring(s)("Name: \f0%s \f7CN: \f1%d \f7Location: \f2%s",colorname(ci), ci->clientnum,lmsg[0]);
                                sendf(CMD_SENDER, 1, "ris", N_SERVMSG, s);
                            }
                        }
                    } else {
                        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Player not connected");
                    }
                /*} else {
                    usage = true;
                }*/
            } else {
                usage = true;
            }
        } else {
            cn = CMD_SENDER;
            goto sendinfo;
        }

        if(usage) sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
    }